

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CustomPrinterForMultilineComments_Test::
~TextFormatTest_CustomPrinterForMultilineComments_Test
          (TextFormatTest_CustomPrinterForMultilineComments_Test *this)

{
  TextFormatTest_CustomPrinterForMultilineComments_Test *this_local;
  
  ~TextFormatTest_CustomPrinterForMultilineComments_Test(this);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

TEST_F(TextFormatTest, CustomPrinterForMultilineComments) {
  proto2_unittest::TestAllTypes message;
  message.mutable_optional_nested_message();
  message.mutable_optional_import_message()->set_d(42);
  TextFormat::Printer printer;
  CustomMessageFieldValuePrinter my_field_printer;
  printer.SetDefaultFieldValuePrinter(new CustomMultilineCommentPrinter());
  std::string text;
  printer.PrintToString(message, &text);
  EXPECT_EQ(
      "optional_nested_message {  # 1\n"
      "  # 2\n"
      "}\n"
      "optional_import_message {  # 1\n"
      "  # 2\n"
      "  d: 42\n"
      "}\n",
      text);
}